

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O3

b_str<char32_t> *
detail::operator|(b_str<char32_t> *__return_storage_ptr__,b_str<char32_t> *str,
                 split_helper_subroutine<detail::split_at_first_back,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_char32_t>
                 *info)

{
  size_t sVar1;
  ulong uVar2;
  char32_t *pcVar3;
  pointer pcVar4;
  undefined8 uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar6;
  size_type __n;
  ulong uVar7;
  size_t __i;
  size_t sVar8;
  size_t __i_1;
  size_type *psVar9;
  
  sVar1 = (info->delim)._M_len;
  uVar2 = str->_M_string_length;
  if (uVar2 != 0 && sVar1 != 0) {
    pcVar3 = (info->delim)._M_str;
    psVar9 = &str->_M_string_length;
    pcVar4 = (str->_M_dataplus)._M_p;
    uVar7 = 0;
    do {
      sVar8 = 0;
      do {
        if (pcVar3[sVar8] == pcVar4[uVar7]) {
          if (uVar7 == 0xffffffffffffffff) goto LAB_001b2d8a;
          __n = 0xffffffffffffffff;
          if (uVar2 <= uVar7) goto LAB_001b2d9d;
          goto LAB_001b2d69;
        }
        sVar8 = sVar8 + 1;
      } while (sVar1 != sVar8);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar2);
  }
LAB_001b2d8a:
  paVar6 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar6;
  psVar9 = &__return_storage_ptr__->_M_string_length;
  goto LAB_001b2dd7;
LAB_001b2d69:
  do {
    __n = uVar7;
    sVar8 = 0;
    while (pcVar3[sVar8] != pcVar4[__n]) {
      sVar8 = sVar8 + 1;
      if (sVar1 == sVar8) goto LAB_001b2d9d;
    }
    uVar7 = __n + 1;
    __n = 0xffffffffffffffff;
  } while (uVar7 != uVar2);
LAB_001b2d9d:
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::erase
            (str,0,__n);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = (str->_M_dataplus)._M_p;
  paVar6 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)pcVar4 == paVar6) {
    uVar5 = *(undefined8 *)((long)&str->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar6;
LAB_001b2dd7:
  *psVar9 = 0;
  paVar6->_M_local_buf[0] = L'\0';
  return __return_storage_ptr__;
}

Assistant:

b_str<CharType> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first_back, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return {};
		str.erase(0, str.find_first_not_of(info.delim, pos));
		return std::move(str);
	}